

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_read_dir(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_20;
  size_t local_18;
  char local_e [2];
  int local_c;
  char buf [2];
  int r;
  
  loop = uv_default_loop();
  rmdir("test_dir");
  local_c = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (local_c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xdde,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (mkdir_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xde0,"mkdir_cb_count == 1");
    abort();
  }
  local_c = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
  if (local_c < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xdea,"r >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  uVar3 = uv_buf_init(local_e,2);
  local_20 = uVar3.base;
  iov.base = local_20;
  local_18 = uVar3.len;
  iov.len = local_18;
  local_c = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
  if (local_c != -0x15) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xdfe,"r == UV_EISDIR");
    abort();
  }
  uv_fs_req_cleanup(&read_req);
  local_c = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
  if (local_c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xe03,"r == 0");
    abort();
  }
  uv_fs_req_cleanup(&close_req);
  rmdir("test_dir");
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xe09,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_read_dir) {
  int r;
  char buf[2];
  loop = uv_default_loop();

  /* Setup */
  rmdir("test_dir");
  r = uv_fs_mkdir(loop, &mkdir_req, "test_dir", 0755, mkdir_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkdir_cb_count == 1);
  /* Setup Done Here */

  /* Get a file descriptor for the directory */
  r = uv_fs_open(loop,
                 &open_req1,
                 "test_dir",
                 UV_FS_O_RDONLY | UV_FS_O_DIRECTORY,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);

  /* Try to read data from the directory */
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, 0, NULL);
#if defined(__FreeBSD__)   || \
    defined(__OpenBSD__)   || \
    defined(__NetBSD__)    || \
    defined(__DragonFly__) || \
    defined(_AIX)          || \
    defined(__sun)         || \
    defined(__MVS__)
  /*
   * As of now, these operating systems support reading from a directory,
   * that too depends on the filesystem this temporary test directory is
   * created on. That is why this assertion is a bit lenient.
   */
  ASSERT((r >= 0) || (r == UV_EISDIR));
#else
  ASSERT(r == UV_EISDIR);
#endif
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  rmdir("test_dir");

  MAKE_VALGRIND_HAPPY();
  return 0;
}